

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_qrshl_u32_aarch64(CPUARMState_conflict *env,uint32_t val,uint32_t shiftop)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)shiftop;
  if ((char)bVar2 < ' ') {
    if ((char)bVar2 < -0x20) {
      return 0;
    }
    if ((shiftop & 0xff) == 0xe0) {
      return val >> 0x1f;
    }
    if ((char)bVar2 < '\0') {
      return (uint32_t)((1L << (~bVar2 & 0x3f)) + (ulong)val >> (-bVar2 & 0x3f));
    }
    uVar1 = val << (bVar2 & 0x1f);
    if (uVar1 >> (bVar2 & 0x1f) == val) {
      return uVar1;
    }
  }
  else if (val == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  return 0xffffffff;
}

Assistant:

uint32_t HELPER(neon_qrshl_u32)(CPUARMState *env, uint32_t val, uint32_t shiftop)
{
    uint32_t dest;
    int8_t shift = (int8_t)shiftop;
    if (shift >= 32) {
        if (val) {
            SET_QC();
            dest = ~0;
        } else {
            dest = 0;
        }
    } else if (shift < -32) {
        dest = 0;
    } else if (shift == -32) {
        dest = val >> 31;
    } else if (shift < 0) {
        uint64_t big_dest = ((uint64_t)val + (1ULL << (-1 - shift)));
        dest = big_dest >> -shift;
    } else {
        dest = val << shift;
        if ((dest >> shift) != val) {
            SET_QC();
            dest = ~0;
        }
    }
    return dest;
}